

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCanonicalizerAndResolverTester.cpp
# Opt level: O2

void __thiscall
psy::C::TypeCanonicalizerAndResolverTester::case0026(TypeCanonicalizerAndResolverTester *this)

{
  Expectation *pEVar1;
  Decl *pDVar2;
  allocator<char> local_372;
  allocator<char> local_371;
  string local_370;
  string local_350;
  string local_330;
  Expectation local_310;
  Expectation local_258;
  Decl local_1a0;
  Decl local_d8;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"\nvoid f ( ) { x y ; }\n",&local_371);
  Expectation::Expectation(&local_310);
  std::__cxx11::string::string
            ((string *)&local_350,
             (string *)
             &TypeCanonicalizer::DiagnosticsReporter::ID_of_TypeDeclarationNotFound_abi_cxx11_);
  pEVar1 = Expectation::diagnostic(&local_310,Error,&local_350);
  Decl::Decl(&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"y",&local_372);
  pDVar2 = Decl::Object(&local_1a0,&local_370,VariableDeclaration,Block);
  pDVar2 = Ty::Unknown(&pDVar2->ty_);
  Decl::Decl(&local_d8,pDVar2);
  pEVar1 = Expectation::declaration(pEVar1,&local_d8);
  Expectation::Expectation(&local_258,pEVar1);
  canonicalizerAndResolveTypes(this,&local_330,&local_258);
  Expectation::~Expectation(&local_258);
  Decl::~Decl(&local_d8);
  std::__cxx11::string::~string((string *)&local_370);
  Decl::~Decl(&local_1a0);
  std::__cxx11::string::~string((string *)&local_350);
  Expectation::~Expectation(&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  return;
}

Assistant:

void TypeCanonicalizerAndResolverTester::case0026()
{
    auto s = R"(
void f ( ) { x y ; }
)";

    canonicalizerAndResolveTypes(s,
            Expectation()
            .diagnostic(Expectation::ErrorOrWarn::Error,
                        TypeCanonicalizer::DiagnosticsReporter::ID_of_TypeDeclarationNotFound)
            .declaration(
                Decl().Object("y", SymbolKind::VariableDeclaration, ScopeKind::Block)
                      .ty_.Unknown()));
}